

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderTextureSizeTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::ShaderTextureSizeTests::init
          (ShaderTextureSizeTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  TextureSizeCase *this_00;
  char *name_00;
  char *desc_00;
  ShaderTextureSizeTests *pSVar1;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  string desc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string name;
  int sampleCountNdx;
  int samplerTypeNdx;
  ShaderTextureSizeTests *this_local;
  
  name.field_2._12_4_ = 0;
  pSVar1 = this;
  while ((int)name.field_2._12_4_ < 6) {
    for (name.field_2._8_4_ = 0; (int)name.field_2._8_4_ < 2;
        name.field_2._8_4_ = name.field_2._8_4_ + 1) {
      std::__cxx11::string::string((string *)&local_b8);
      std::operator+(&local_98,&local_b8,"samples_");
      de::toString<int>((string *)((long)&desc.field_2 + 8),
                        init::sampleCounts + (int)name.field_2._8_4_);
      std::operator+(&local_78,&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&desc.field_2 + 8));
      std::operator+(&local_58,&local_78,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                     &local_58,init::samplerTypes[(int)name.field_2._12_4_].name);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)(desc.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::string((string *)&local_188);
      std::operator+(&local_168,&local_188,"samples count = ");
      de::toString<int>(&local_1a8,init::sampleCounts + (int)name.field_2._8_4_);
      std::operator+(&local_148,&local_168,&local_1a8);
      std::operator+(&local_128,&local_148,", type = ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     &local_128,init::samplerTypes[(int)name.field_2._12_4_].name);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_188);
      this_00 = (TextureSizeCase *)operator_new(0xb8);
      context = (this->super_TestCaseGroup).m_context;
      name_00 = (char *)std::__cxx11::string::c_str();
      desc_00 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::TextureSizeCase::TextureSizeCase
                (this_00,context,name_00,desc_00,init::samplerTypes[(int)name.field_2._12_4_].type,
                 init::sampleCounts[(int)name.field_2._8_4_]);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
      std::__cxx11::string::~string((string *)local_108);
      std::__cxx11::string::~string((string *)local_38);
    }
    name.field_2._12_4_ = name.field_2._12_4_ + 1;
    pSVar1 = (ShaderTextureSizeTests *)(ulong)(uint)name.field_2._12_4_;
  }
  return (int)pSVar1;
}

Assistant:

void ShaderTextureSizeTests::init (void)
{
	static const struct SamplerType
	{
		TextureSizeCase::TextureType	type;
		const char*						name;
	} samplerTypes[] =
	{
		{ TextureSizeCase::TEXTURE_FLOAT_2D,		"texture_2d"			},
		{ TextureSizeCase::TEXTURE_FLOAT_2D_ARRAY,	"texture_2d_array"		},
		{ TextureSizeCase::TEXTURE_INT_2D,			"texture_int_2d"		},
		{ TextureSizeCase::TEXTURE_INT_2D_ARRAY,	"texture_int_2d_array"	},
		{ TextureSizeCase::TEXTURE_UINT_2D,			"texture_uint_2d"		},
		{ TextureSizeCase::TEXTURE_UINT_2D_ARRAY,	"texture_uint_2d_array"	},
	};

	static const int sampleCounts[] = { 1, 4 };

	for (int samplerTypeNdx = 0; samplerTypeNdx < DE_LENGTH_OF_ARRAY(samplerTypes); ++samplerTypeNdx)
	{
		for (int sampleCountNdx = 0; sampleCountNdx < DE_LENGTH_OF_ARRAY(sampleCounts); ++sampleCountNdx)
		{
			const std::string name = std::string() + "samples_" + de::toString(sampleCounts[sampleCountNdx]) + "_" + samplerTypes[samplerTypeNdx].name;
			const std::string desc = std::string() + "samples count = " + de::toString(sampleCounts[sampleCountNdx]) + ", type = " + samplerTypes[samplerTypeNdx].name;

			addChild(new TextureSizeCase(m_context, name.c_str(), desc.c_str(), samplerTypes[samplerTypeNdx].type, sampleCounts[sampleCountNdx]));
		}
	}
}